

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall gvr::Mesh::recalculateNormals(Mesh *this)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  uint *puVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  int k;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pfVar3 = this->normal;
  for (uVar6 = (ulong)(uint)((this->super_PointCloud).n * 3); 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    pfVar3[uVar6 - 1] = 0.0;
  }
  puVar4 = this->triangle;
  pfVar3 = (this->super_PointCloud).vertex;
  pfVar5 = this->normal;
  uVar8 = 0;
  puVar9 = puVar4;
  uVar6 = (ulong)(uint)this->n;
  if (this->n < 1) {
    uVar6 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    lVar10 = (long)(int)puVar4[uVar8 * 3 + 1];
    lVar7 = (long)(int)puVar4[uVar8 * 3];
    fVar15 = pfVar3[lVar10 * 3] - pfVar3[lVar7 * 3];
    fVar13 = pfVar3[lVar10 * 3 + 1] - pfVar3[lVar7 * 3 + 1];
    fVar11 = pfVar3[lVar10 * 3 + 2] - pfVar3[lVar7 * 3 + 2];
    lVar10 = (long)(int)puVar4[uVar8 * 3 + 2];
    fVar17 = pfVar3[lVar10 * 3] - pfVar3[lVar7 * 3];
    fVar12 = pfVar3[lVar10 * 3 + 1] - pfVar3[lVar7 * 3 + 1];
    fVar16 = pfVar3[lVar10 * 3 + 2] - pfVar3[lVar7 * 3 + 2];
    fVar14 = fVar13 * fVar16 - fVar12 * fVar11;
    fVar11 = fVar11 * fVar17 - fVar16 * fVar15;
    fVar12 = fVar12 * fVar15 - fVar17 * fVar13;
    fVar13 = SQRT(fVar12 * fVar12 + fVar14 * fVar14 + fVar11 * fVar11);
    if (0.0 < fVar13) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        uVar2 = puVar9[lVar7];
        pfVar5[uVar2 * 3] = pfVar5[uVar2 * 3] + fVar14 / fVar13;
        uVar1 = uVar2 * 3 + 1;
        pfVar5[uVar1] = pfVar5[uVar1] + fVar11 / fVar13;
        uVar1 = uVar2 * 3 + 2;
        pfVar5[uVar1] = pfVar5[uVar1] + fVar12 / fVar13;
      }
    }
    puVar9 = puVar9 + 3;
  }
  normalizeNormals(this);
  return;
}

Assistant:

void Mesh::recalculateNormals()
{
  for (int i=3*getVertexCount()-1; i>=0; i--)
  {
    normal[i]=0;
  }

  /* compute normals of triangles and sum for each vertex */

  for (int i=0; i<n; i++)
  {
    float x0=getVertexComp(triangle[3*i+1], 0)-getVertexComp(triangle[3*i], 0);
    float y0=getVertexComp(triangle[3*i+1], 1)-getVertexComp(triangle[3*i], 1);
    float z0=getVertexComp(triangle[3*i+1], 2)-getVertexComp(triangle[3*i], 2);

    float x1=getVertexComp(triangle[3*i+2], 0)-getVertexComp(triangle[3*i], 0);
    float y1=getVertexComp(triangle[3*i+2], 1)-getVertexComp(triangle[3*i], 1);
    float z1=getVertexComp(triangle[3*i+2], 2)-getVertexComp(triangle[3*i], 2);

    float nx=y0*z1-z0*y1;
    float ny=z0*x1-x0*z1;
    float nz=x0*y1-y0*x1;

    float len=sqrt(nx*nx+ny*ny+nz*nz);

    if (len > 0)
    {
      nx/=len;
      ny/=len;
      nz/=len;

      for (int k=0; k<3; k++)
      {
        normal[3*triangle[3*i+k]]+=nx;
        normal[3*triangle[3*i+k]+1]+=ny;
        normal[3*triangle[3*i+k]+2]+=nz;
      }
    }
  }

  /* normalize to length 1 */

  normalizeNormals();
}